

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  uint uVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char cVar24;
  char cVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  uint uVar28;
  void *workspace_00;
  ulong uVar29;
  size_t sVar30;
  long lVar31;
  ulong uVar32;
  ulong srcSize;
  long lVar33;
  BYTE *ostart;
  char *buffer;
  char *dst_00;
  undefined1 auVar34 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar63;
  int iVar64;
  undefined1 auVar61 [16];
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint maxSymbolValue_1;
  uint local_74;
  uint *local_70;
  FSE_CTable *local_68;
  void *local_60;
  char *local_58;
  size_t local_50;
  FSE_CTable *local_48;
  size_t local_40;
  size_t local_38;
  
  local_58 = (char *)dst;
  local_50 = maxDstSize;
  workspace_00 = HUF_alignUpWorkspace(workspace,&workspaceSize,4);
  if (workspaceSize < 0x2ec) {
    return 0xffffffffffffffff;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  *(undefined1 *)((long)workspace_00 + 0x1e0) = 0;
  auVar27 = _DAT_0027d800;
  uVar1 = huffLog + 1;
  if (1 < uVar1) {
    lVar31 = (ulong)uVar1 - 2;
    auVar34._8_4_ = (int)lVar31;
    auVar34._0_8_ = lVar31;
    auVar34._12_4_ = (int)((ulong)lVar31 >> 0x20);
    lVar31 = 0;
    auVar52 = pmovsxbq(in_XMM3,0xb0a);
    auVar53 = pmovsxbq(in_XMM4,0x908);
    auVar54 = pmovsxbq(in_XMM5,0x706);
    auVar55 = pmovsxbq(in_XMM6,0x504);
    auVar56 = pmovsxbq(in_XMM7,0x302);
    auVar57 = pmovsxbq(in_XMM8,0x100);
    lVar33 = 0;
    do {
      auVar58._8_4_ = (int)lVar33;
      auVar58._0_8_ = lVar33;
      auVar58._12_4_ = (int)((ulong)lVar33 >> 0x20);
      auVar61 = auVar34 ^ auVar27;
      auVar66 = (auVar58 | auVar57) ^ auVar27;
      iVar60 = auVar61._0_4_;
      iVar79 = -(uint)(iVar60 < auVar66._0_4_);
      iVar63 = auVar61._4_4_;
      auVar68._4_4_ = -(uint)(iVar63 < auVar66._4_4_);
      iVar64 = auVar61._8_4_;
      iVar83 = -(uint)(iVar64 < auVar66._8_4_);
      iVar65 = auVar61._12_4_;
      auVar68._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
      auVar35._4_4_ = iVar79;
      auVar35._0_4_ = iVar79;
      auVar35._8_4_ = iVar83;
      auVar35._12_4_ = iVar83;
      auVar35 = pshuflw(in_XMM1,auVar35,0xe8);
      auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar63);
      auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar44 = pshuflw(in_XMM2,auVar67,0xe8);
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar66 = pshuflw(auVar35,auVar68,0xe8);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar61 = (auVar66 | auVar44 & auVar35) ^ auVar61;
      auVar61 = packssdw(auVar61,auVar61);
      cVar24 = (char)huffLog;
      cVar25 = (char)lVar31;
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e1) = cVar24 + cVar25;
      }
      auVar44._4_4_ = iVar79;
      auVar44._0_4_ = iVar79;
      auVar44._8_4_ = iVar83;
      auVar44._12_4_ = iVar83;
      auVar68 = auVar67 & auVar44 | auVar68;
      auVar61 = packssdw(auVar68,auVar68);
      auVar66._8_4_ = 0xffffffff;
      auVar66._0_8_ = 0xffffffffffffffff;
      auVar66._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar66,auVar61 ^ auVar66);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e2) = cVar24 + cVar25 + -1;
      }
      auVar61 = (auVar58 | auVar56) ^ auVar27;
      auVar45._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar45._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar45._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar45._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar69._4_4_ = auVar45._0_4_;
      auVar69._0_4_ = auVar45._0_4_;
      auVar69._8_4_ = auVar45._8_4_;
      auVar69._12_4_ = auVar45._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar12._4_4_ = iVar79;
      auVar12._0_4_ = iVar79;
      auVar12._8_4_ = iVar83;
      auVar12._12_4_ = iVar83;
      auVar80._4_4_ = auVar45._4_4_;
      auVar80._0_4_ = auVar45._4_4_;
      auVar80._8_4_ = auVar45._12_4_;
      auVar80._12_4_ = auVar45._12_4_;
      auVar61 = auVar12 & auVar69 | auVar80;
      auVar61 = packssdw(auVar61,auVar61);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar3,auVar61 ^ auVar3);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e3) = cVar24 + cVar25 + -2;
      }
      auVar61 = pshufhw(auVar61,auVar69,0x84);
      auVar13._4_4_ = iVar79;
      auVar13._0_4_ = iVar79;
      auVar13._8_4_ = iVar83;
      auVar13._12_4_ = iVar83;
      auVar66 = pshufhw(auVar45,auVar13,0x84);
      auVar35 = pshufhw(auVar61,auVar80,0x84);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar35 | auVar66 & auVar61) ^ auVar36;
      auVar61 = packssdw(auVar36,auVar36);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e4) = cVar24 + cVar25 + -3;
      }
      auVar61 = (auVar58 | auVar55) ^ auVar27;
      auVar46._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar46._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar46._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar46._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar14._4_4_ = auVar46._0_4_;
      auVar14._0_4_ = auVar46._0_4_;
      auVar14._8_4_ = auVar46._8_4_;
      auVar14._12_4_ = auVar46._8_4_;
      auVar66 = pshuflw(auVar80,auVar14,0xe8);
      auVar37._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar37._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar37._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar37._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar70._4_4_ = auVar37._4_4_;
      auVar70._0_4_ = auVar37._4_4_;
      auVar70._8_4_ = auVar37._12_4_;
      auVar70._12_4_ = auVar37._12_4_;
      auVar61 = pshuflw(auVar37,auVar70,0xe8);
      auVar71._4_4_ = auVar46._4_4_;
      auVar71._0_4_ = auVar46._4_4_;
      auVar71._8_4_ = auVar46._12_4_;
      auVar71._12_4_ = auVar46._12_4_;
      auVar35 = pshuflw(auVar46,auVar71,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 & auVar66,(auVar35 | auVar61 & auVar66) ^ auVar4);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e5) = cVar24 + cVar25 + -4;
      }
      auVar15._4_4_ = auVar46._0_4_;
      auVar15._0_4_ = auVar46._0_4_;
      auVar15._8_4_ = auVar46._8_4_;
      auVar15._12_4_ = auVar46._8_4_;
      auVar71 = auVar70 & auVar15 | auVar71;
      auVar35 = packssdw(auVar71,auVar71);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61,auVar35 ^ auVar5);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e6) = cVar24 + cVar25 + -5;
      }
      auVar61 = (auVar58 | auVar54) ^ auVar27;
      auVar47._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar47._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar47._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar47._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar72._4_4_ = auVar47._0_4_;
      auVar72._0_4_ = auVar47._0_4_;
      auVar72._8_4_ = auVar47._8_4_;
      auVar72._12_4_ = auVar47._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar16._4_4_ = iVar79;
      auVar16._0_4_ = iVar79;
      auVar16._8_4_ = iVar83;
      auVar16._12_4_ = iVar83;
      auVar81._4_4_ = auVar47._4_4_;
      auVar81._0_4_ = auVar47._4_4_;
      auVar81._8_4_ = auVar47._12_4_;
      auVar81._12_4_ = auVar47._12_4_;
      auVar61 = auVar16 & auVar72 | auVar81;
      auVar61 = packssdw(auVar61,auVar61);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar6,auVar61 ^ auVar6);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e7) = cVar24 + cVar25 + -6;
      }
      auVar61 = pshufhw(auVar61,auVar72,0x84);
      auVar17._4_4_ = iVar79;
      auVar17._0_4_ = iVar79;
      auVar17._8_4_ = iVar83;
      auVar17._12_4_ = iVar83;
      auVar66 = pshufhw(auVar47,auVar17,0x84);
      auVar35 = pshufhw(auVar61,auVar81,0x84);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar35 | auVar66 & auVar61) ^ auVar38;
      auVar61 = packssdw(auVar38,auVar38);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e8) = cVar24 + cVar25 + -7;
      }
      auVar61 = (auVar58 | auVar53) ^ auVar27;
      auVar48._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar48._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar48._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar48._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar18._4_4_ = auVar48._0_4_;
      auVar18._0_4_ = auVar48._0_4_;
      auVar18._8_4_ = auVar48._8_4_;
      auVar18._12_4_ = auVar48._8_4_;
      auVar66 = pshuflw(auVar81,auVar18,0xe8);
      auVar39._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar39._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar39._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar39._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar73._4_4_ = auVar39._4_4_;
      auVar73._0_4_ = auVar39._4_4_;
      auVar73._8_4_ = auVar39._12_4_;
      auVar73._12_4_ = auVar39._12_4_;
      auVar61 = pshuflw(auVar39,auVar73,0xe8);
      auVar74._4_4_ = auVar48._4_4_;
      auVar74._0_4_ = auVar48._4_4_;
      auVar74._8_4_ = auVar48._12_4_;
      auVar74._12_4_ = auVar48._12_4_;
      auVar35 = pshuflw(auVar48,auVar74,0xe8);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar35 | auVar61 & auVar66) ^ auVar49;
      auVar35 = packssdw(auVar49,auVar49);
      auVar61 = packsswb(auVar61 & auVar66,auVar35);
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1e9) = cVar24 + cVar25 + -8;
      }
      auVar19._4_4_ = auVar48._0_4_;
      auVar19._0_4_ = auVar48._0_4_;
      auVar19._8_4_ = auVar48._8_4_;
      auVar19._12_4_ = auVar48._8_4_;
      auVar74 = auVar73 & auVar19 | auVar74;
      auVar35 = packssdw(auVar74,auVar74);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar7,auVar35 ^ auVar7);
      auVar61 = packsswb(auVar61,auVar35);
      if ((auVar61 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1ea) = cVar24 + cVar25 + -9;
      }
      auVar61 = (auVar58 | auVar52) ^ auVar27;
      auVar50._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar50._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar50._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar50._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar75._4_4_ = auVar50._0_4_;
      auVar75._0_4_ = auVar50._0_4_;
      auVar75._8_4_ = auVar50._8_4_;
      auVar75._12_4_ = auVar50._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar20._4_4_ = iVar79;
      auVar20._0_4_ = iVar79;
      auVar20._8_4_ = iVar83;
      auVar20._12_4_ = iVar83;
      auVar82._4_4_ = auVar50._4_4_;
      auVar82._0_4_ = auVar50._4_4_;
      auVar82._8_4_ = auVar50._12_4_;
      auVar82._12_4_ = auVar50._12_4_;
      auVar61 = auVar20 & auVar75 | auVar82;
      auVar61 = packssdw(auVar61,auVar61);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar8,auVar61 ^ auVar8);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1eb) = cVar24 + cVar25 + -10;
      }
      auVar61 = pshufhw(auVar61,auVar75,0x84);
      auVar21._4_4_ = iVar79;
      auVar21._0_4_ = iVar79;
      auVar21._8_4_ = iVar83;
      auVar21._12_4_ = iVar83;
      auVar66 = pshufhw(auVar50,auVar21,0x84);
      auVar35 = pshufhw(auVar61,auVar82,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar35 | auVar66 & auVar61) ^ auVar40;
      auVar61 = packssdw(auVar40,auVar40);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1ec) = cVar24 + cVar25 + -0xb;
      }
      auVar61 = (auVar58 | _DAT_0027d7a0) ^ auVar27;
      auVar51._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar51._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar51._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar51._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar22._4_4_ = auVar51._0_4_;
      auVar22._0_4_ = auVar51._0_4_;
      auVar22._8_4_ = auVar51._8_4_;
      auVar22._12_4_ = auVar51._8_4_;
      auVar66 = pshuflw(auVar82,auVar22,0xe8);
      auVar41._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar41._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar41._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar41._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar76._4_4_ = auVar41._4_4_;
      auVar76._0_4_ = auVar41._4_4_;
      auVar76._8_4_ = auVar41._12_4_;
      auVar76._12_4_ = auVar41._12_4_;
      auVar61 = pshuflw(auVar41,auVar76,0xe8);
      auVar77._4_4_ = auVar51._4_4_;
      auVar77._0_4_ = auVar51._4_4_;
      auVar77._8_4_ = auVar51._12_4_;
      auVar77._12_4_ = auVar51._12_4_;
      auVar35 = pshuflw(auVar51,auVar77,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 & auVar66,(auVar35 | auVar61 & auVar66) ^ auVar9);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1ed) = cVar24 + cVar25 + -0xc;
      }
      auVar23._4_4_ = auVar51._0_4_;
      auVar23._0_4_ = auVar51._0_4_;
      auVar23._8_4_ = auVar51._8_4_;
      auVar23._12_4_ = auVar51._8_4_;
      auVar77 = auVar76 & auVar23 | auVar77;
      auVar35 = packssdw(auVar77,auVar77);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61,auVar35 ^ auVar10);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1ee) = cVar24 + cVar25 + -0xd;
      }
      auVar61 = (auVar58 | _DAT_0027d790) ^ auVar27;
      auVar42._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar42._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar42._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar42._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar78._4_4_ = auVar42._0_4_;
      auVar78._0_4_ = auVar42._0_4_;
      auVar78._8_4_ = auVar42._8_4_;
      auVar78._12_4_ = auVar42._8_4_;
      auVar59._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar59._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar62._4_4_ = auVar42._4_4_;
      auVar62._0_4_ = auVar42._4_4_;
      auVar62._8_4_ = auVar42._12_4_;
      auVar62._12_4_ = auVar42._12_4_;
      auVar35 = auVar59 & auVar78 | auVar62;
      auVar61 = packssdw(auVar42,auVar35);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar11,auVar61 ^ auVar11);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1ef) = cVar24 + cVar25 + -0xe;
      }
      auVar61 = pshufhw(auVar61,auVar78,0x84);
      in_XMM2 = pshufhw(auVar35,auVar59,0x84);
      in_XMM2 = in_XMM2 & auVar61;
      auVar61 = pshufhw(auVar61,auVar62,0x84);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar43 = (auVar61 | in_XMM2) ^ auVar43;
      auVar61 = packssdw(auVar43,auVar43);
      in_XMM1 = packsswb(auVar61,auVar61);
      if ((in_XMM1 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace_00 + lVar33 + 0x1f0) = cVar24 + cVar25 + -0xf;
      }
      lVar33 = lVar33 + 0x10;
      lVar31 = lVar31 + -0x10;
    } while (-lVar31 != ((ulong)uVar1 + 0xe & 0xfffffffffffffff0));
  }
  srcSize = (ulong)maxSymbolValue;
  if (maxSymbolValue != 0) {
    uVar29 = 0;
    do {
      *(undefined1 *)((long)workspace_00 + uVar29 + 0x1ed) =
           *(undefined1 *)((long)workspace_00 + (ulong)(byte)CTable[uVar29 + 1] + 0x1e0);
      uVar29 = uVar29 + 1;
    } while (srcSize != uVar29);
  }
  if (local_50 == 0) {
    return 0xffffffffffffffba;
  }
  buffer = local_58 + 1;
  local_60 = (void *)((long)workspace_00 + 0x1ed);
  local_38 = 0x1e0;
  local_74 = 0xc;
  local_68 = (FSE_CTable *)HUF_alignUpWorkspace(workspace_00,&local_38,4);
  uVar29 = 0xffffffffffffffff;
  if (0x1df < local_38) {
    if (maxSymbolValue < 2) {
      uVar29 = 0;
    }
    else {
      puVar2 = local_68 + 100;
      uVar28 = HIST_count_simple(puVar2,&local_74,local_60,srcSize);
      uVar1 = local_74;
      uVar32 = (ulong)(uVar28 == maxSymbolValue);
      uVar29 = uVar32;
      if (uVar28 != maxSymbolValue && uVar28 != 1) {
        local_70 = puVar2;
        uVar28 = FSE_optimalTableLog_internal(6,srcSize,local_74,2);
        puVar2 = local_70;
        local_48 = local_68 + 0x71;
        local_70 = (uint *)CONCAT44(local_70._4_4_,uVar1);
        uVar29 = FSE_normalizeCount((short *)local_48,uVar28,puVar2,srcSize,uVar1,0);
        if (uVar29 < 0xffffffffffffff89) {
          local_40 = local_50 - 1;
          sVar30 = FSE_writeNCount(buffer,local_40,(short *)local_48,(uint)local_70,uVar28);
          uVar29 = sVar30;
          if (sVar30 < 0xffffffffffffff89) {
            uVar29 = FSE_buildCTable_wksp
                               (local_68,(short *)local_48,(uint)local_70,uVar28,local_68 + 0x3b,
                                0xa4);
            if (uVar29 < 0xffffffffffffff89) {
              dst_00 = buffer + sVar30;
              uVar29 = FSE_compress_usingCTable(dst_00,local_40 - sVar30,local_60,srcSize,local_68);
              if (uVar29 < 0xffffffffffffff89) {
                if (uVar29 == 0) {
                  bVar26 = false;
                  uVar29 = 0;
                }
                else {
                  dst_00 = dst_00 + uVar29;
                  bVar26 = true;
                  uVar29 = uVar32;
                }
              }
              else {
                bVar26 = false;
              }
              if (bVar26) {
                uVar29 = (long)dst_00 - (long)buffer;
              }
            }
          }
        }
      }
    }
  }
  if (uVar29 < 0xffffffffffffff89) {
    if (maxSymbolValue >> 1 <= uVar29 || uVar29 < 2) {
      bVar26 = true;
      goto LAB_00159f9d;
    }
    *local_58 = (char)uVar29;
    uVar29 = uVar29 + 1;
  }
  bVar26 = false;
LAB_00159f9d:
  if ((bVar26) && (uVar29 = 0xffffffffffffffff, maxSymbolValue < 0x81)) {
    uVar32 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
    uVar29 = 0xffffffffffffffba;
    if (uVar32 <= local_50) {
      *local_58 = (char)maxSymbolValue + '\x7f';
      *(undefined1 *)((long)local_60 + srcSize) = 0;
      uVar29 = uVar32;
      if (maxSymbolValue != 0) {
        uVar32 = 0;
        do {
          *buffer = *(char *)((long)workspace_00 + uVar32 + 0x1ed) * '\x10' +
                    *(char *)((long)workspace_00 + uVar32 + 0x1ee);
          uVar32 = uVar32 + 2;
          buffer = buffer + 1;
        } while (uVar32 < srcSize);
      }
    }
  }
  return uVar29;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    HUF_CElt const* const ct = CTable + 1;
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)HUF_alignUpWorkspace(workspace, &workspaceSize, ZSTD_ALIGNOF(U32));

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE >= sizeof(HUF_WriteCTableWksp));

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[HUF_getNbBits(ct[n])];

    /* attempt weights compression by FSE */
    if (maxDstSize < 1) return ERROR(dstSize_tooSmall);
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}